

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void __thiscall
Memory::HeapInfo::SweepPartialReusePages(HeapInfo *this,RecyclerSweep *recyclerSweep)

{
  size_t *psVar1;
  bool bVar2;
  RecyclerSweepManager *pRVar3;
  size_t sVar4;
  Recycler *pRVar5;
  long lVar6;
  
  lVar6 = 0x78;
  do {
    HeapBucketGroup<SmallAllocationBlockAttributes>::SweepPartialReusePages
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar6),recyclerSweep);
    lVar6 = lVar6 + 0x380;
  } while (lVar6 != 0xa878);
  lVar6 = 0;
  do {
    HeapBucketGroup<MediumAllocationBlockAttributes>::SweepPartialReusePages
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&this->mediumHeapBuckets[0].heapBucket.
                       super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .
                       super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .super_HeapBucket.heapInfo + lVar6),recyclerSweep);
    lVar6 = lVar6 + 0x380;
  } while (lVar6 != 0x6580);
  pRVar3 = RecyclerSweep::GetManager(recyclerSweep);
  bVar2 = RecyclerSweepManager::InPartialCollect(pRVar3);
  if (bVar2) {
    pRVar3 = RecyclerSweep::GetManager(recyclerSweep);
    sVar4 = RecyclerSweepManager::GetPartialUnusedFreeByteCount(pRVar3);
    pRVar5 = RecyclerSweep::GetRecycler(recyclerSweep);
    psVar1 = &(pRVar5->autoHeap).unusedPartialCollectFreeBytes;
    *psVar1 = *psVar1 + sVar4;
  }
  return;
}

Assistant:

void
HeapInfo::SweepPartialReusePages(RecyclerSweep& recyclerSweep)
{
    RECYCLER_PROFILE_EXEC_THREAD_BEGIN(recyclerSweep.IsBackground(), recyclerSweep.GetRecycler(), Js::SweepPartialReusePhase);

    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].SweepPartialReusePages(recyclerSweep);
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].SweepPartialReusePages(recyclerSweep);
    }
#endif

    RECYCLER_PROFILE_EXEC_THREAD_END(recyclerSweep.IsBackground(), recyclerSweep.GetRecycler(), Js::SweepPartialReusePhase);

    // GC-TODO: LargeHeapBlock don't reuse object, so we don't need to keep
    // pages with low free space from being reused.

    // Only count the byte that we would have freed but we are not reusing it if we are doing a partial GC
    // This will increase the GC pressure and make partial less and less likely.
    if (recyclerSweep.GetManager()->InPartialCollect())
    {
        recyclerSweep.GetRecycler()->autoHeap.unusedPartialCollectFreeBytes += recyclerSweep.GetManager()->GetPartialUnusedFreeByteCount();
    }
}